

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallAndroidMKGenerator.cxx
# Opt level: O1

void __thiscall
cmExportInstallAndroidMKGenerator::GenerateImportHeaderCode
          (cmExportInstallAndroidMKGenerator *this,ostream *os,string *param_2)

{
  cmInstallExportGenerator *pcVar1;
  pointer pcVar2;
  cmExportSet *pcVar3;
  cmTargetExport *pcVar4;
  cmInstallTargetGenerator *pcVar5;
  cmTarget *this_00;
  TargetType TVar6;
  size_t sVar7;
  ostream *poVar8;
  pointer ppcVar9;
  long lVar10;
  string dest;
  string path;
  string installDir;
  string local_d0;
  string local_b0;
  char *local_90;
  undefined8 local_88;
  char local_80;
  undefined7 uStack_7f;
  char *local_70;
  long local_68;
  char local_60;
  undefined7 uStack_5f;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  pcVar1 = (this->super_cmExportInstallFileGenerator).IEGen;
  local_50 = local_40;
  pcVar2 = (pcVar1->super_cmInstallGenerator).Destination._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar2,
             pcVar2 + (pcVar1->super_cmInstallGenerator).Destination._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(os,"LOCAL_PATH := $(call my-dir)\n",0x1d);
  sVar7 = cmsys::SystemTools::CountChar((char *)local_50,'/');
  local_70 = &local_60;
  local_68 = 0;
  local_60 = '\0';
  lVar10 = sVar7 + (local_48 != 0);
  if (lVar10 != 0) {
    do {
      std::__cxx11::string::append((char *)&local_70);
      lVar10 = lVar10 + -1;
    } while (lVar10 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"_IMPORT_PREFIX := ",0x12);
  std::__ostream_insert<char,std::char_traits<char>>(os,"$(LOCAL_PATH)",0xd);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>(os,local_70,local_68);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n\n",2);
  pcVar3 = ((this->super_cmExportInstallFileGenerator).IEGen)->ExportSet;
  ppcVar9 = (pcVar3->TargetExports).
            super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppcVar9 !=
      (pcVar3->TargetExports).
      super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      pcVar4 = *ppcVar9;
      TVar6 = cmGeneratorTarget::GetType(pcVar4->Target);
      if (TVar6 != INTERFACE_LIBRARY) {
        local_88 = 0;
        local_80 = '\0';
        pcVar5 = pcVar4->LibraryGenerator;
        local_90 = &local_80;
        if (pcVar5 != (cmInstallTargetGenerator *)0x0) {
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"");
          cmInstallTargetGenerator::GetDestination(&local_b0,pcVar5,&local_d0);
          std::__cxx11::string::operator=((string *)&local_90,(string *)&local_b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
          }
        }
        pcVar5 = pcVar4->ArchiveGenerator;
        if (pcVar5 != (cmInstallTargetGenerator *)0x0) {
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"");
          cmInstallTargetGenerator::GetDestination(&local_b0,pcVar5,&local_d0);
          std::__cxx11::string::operator=((string *)&local_90,(string *)&local_b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
          }
        }
        this_00 = pcVar4->Target->Target;
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"__dest","");
        cmTarget::SetProperty(this_00,&local_b0,local_90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        if (local_90 != &local_80) {
          operator_delete(local_90,CONCAT71(uStack_7f,local_80) + 1);
        }
      }
      ppcVar9 = ppcVar9 + 1;
    } while (ppcVar9 !=
             (((this->super_cmExportInstallFileGenerator).IEGen)->ExportSet->TargetExports).
             super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
  }
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  return;
}

Assistant:

void cmExportInstallAndroidMKGenerator::GenerateImportHeaderCode(
  std::ostream& os, const std::string&)
{
  std::string installDir = this->IEGen->GetDestination();
  os << "LOCAL_PATH := $(call my-dir)\n";
  size_t numDotDot = cmSystemTools::CountChar(installDir.c_str(), '/');
  numDotDot += installDir.empty() ? 0 : 1;
  std::string path;
  for (size_t n = 0; n < numDotDot; n++) {
    path += "/..";
  }
  os << "_IMPORT_PREFIX := "
     << "$(LOCAL_PATH)" << path << "\n\n";
  for (std::vector<cmTargetExport*>::const_iterator tei =
         this->IEGen->GetExportSet()->GetTargetExports()->begin();
       tei != this->IEGen->GetExportSet()->GetTargetExports()->end(); ++tei) {
    // Collect import properties for this target.
    cmTargetExport const* te = *tei;
    if (te->Target->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
      continue;
    }
    std::string dest;
    if (te->LibraryGenerator) {
      dest = te->LibraryGenerator->GetDestination("");
    }
    if (te->ArchiveGenerator) {
      dest = te->ArchiveGenerator->GetDestination("");
    }
    te->Target->Target->SetProperty("__dest", dest.c_str());
  }
}